

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

boolean undiscovered_artifact(xchar m)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = 0;
  do {
    if (artidisco[lVar1] == m) {
      return '\0';
    }
  } while ((artidisco[lVar1] != '\0') && (bVar2 = lVar1 != 0x23, lVar1 = lVar1 + 1, bVar2));
  return '\x01';
}

Assistant:

boolean undiscovered_artifact(xchar m)
{
    int i;

    /* look for this artifact in the discoveries list;
       if we hit an empty slot then it's undiscovered */
    for (i = 0; i < NROFARTIFACTS; i++)
	if (artidisco[i] == m)
	    return FALSE;
	else if (artidisco[i] == 0)
	    break;
    return TRUE;
}